

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

int clip_uhd_num_image_embeds_col(clip_ctx *ctx_clip)

{
  slice_instructions inst;
  slice_instructions sStack_48;
  
  llava_uhd::get_slice_instructions(&sStack_48,ctx_clip,&ctx_clip->load_image_size);
  if (sStack_48.slices.
      super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sStack_48.slices.
                    super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)sStack_48.slices.
                          super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sStack_48.slices.
                          super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return sStack_48.grid_size.width;
}

Assistant:

int clip_uhd_num_image_embeds_col(struct clip_ctx * ctx_clip) {
    const auto inst = llava_uhd::get_slice_instructions(ctx_clip, ctx_clip->load_image_size);
    return inst.grid_size.width;
}